

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowOpts.cpp
# Opt level: O0

void __thiscall wasm::DataFlowOpts::DataFlowOpts(DataFlowOpts *this)

{
  DataFlowOpts *this_local;
  
  WalkerPass<wasm::PostWalker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>_>::
  WalkerPass(&this->
              super_WalkerPass<wasm::PostWalker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>_>
            );
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>_>)
  .super_Pass._vptr_Pass = (_func_int **)&PTR__DataFlowOpts_0309abf0;
  DataFlow::Users::Users(&this->nodeUsers);
  std::
  unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
  ::unordered_set(&this->workLeft);
  DataFlow::Graph::Graph(&this->graph);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }